

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

int imagetopnm(opj_image_t *image,char *outfile,int force_split)

{
  OPJ_UINT32 OVar1;
  opj_image_comp_t *poVar2;
  OPJ_INT32 *pOVar3;
  uint uVar4;
  size_t sVar5;
  char *pcVar6;
  FILE *pFVar7;
  undefined8 uVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint *puVar19;
  uint *local_70;
  uint *local_68;
  int local_60;
  int local_5c;
  
  poVar2 = image->comps;
  OVar1 = poVar2->prec;
  pcVar6 = outfile;
  if ((int)OVar1 < 0x11) {
    do {
      pcVar9 = pcVar6;
      pcVar6 = pcVar9 + 1;
    } while (*pcVar9 != '\0');
    uVar15 = 1;
    if ((pcVar9[-2] & 0xdfU) != 0x47) {
      uVar15 = (ulong)image->numcomps;
    }
    uVar14 = (uint)uVar15;
    if ((force_split == 0) &&
       ((uVar14 == 2 ||
        (((((2 < uVar14 && (poVar2->dx == poVar2[1].dx)) && (poVar2[1].dx == poVar2[2].dx)) &&
          ((poVar2->dy == poVar2[1].dy && (poVar2[1].dy == poVar2[2].dy)))) &&
         ((OVar1 == poVar2[1].prec && (poVar2[1].prec == poVar2[2].prec)))))))) {
      pFVar7 = fopen(outfile,"wb");
      if (pFVar7 == (FILE *)0x0) {
        fprintf(_stderr,"ERROR -> failed to open %s for writing\n",outfile);
        goto LAB_0010b6cb;
      }
      poVar2 = image->comps;
      if (uVar14 < 3) {
        local_68 = (uint *)0x0;
        local_70 = (uint *)0x0;
      }
      else {
        local_70 = (uint *)poVar2[1].data;
        local_68 = (uint *)poVar2[2].data;
      }
      uVar10 = poVar2->w;
      uVar4 = poVar2->h;
      uVar11 = ~(-1 << ((byte)OVar1 & 0x1f));
      pOVar3 = poVar2->data;
      if ((uVar14 == 4) || (uVar14 == 2)) {
        pcVar6 = "GRAYSCALE_ALPHA";
        if (2 < uVar14) {
          pcVar6 = "RGB_ALPHA";
        }
        uVar8 = opj_version();
        fprintf(pFVar7,
                "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\nMAXVAL %d\nTUPLTYPE %s\nENDHDR\n"
                ,uVar8,(ulong)uVar10,(ulong)uVar4,uVar15,(ulong)uVar11,pcVar6);
        poVar2 = image->comps;
        uVar11 = uVar14 - 1;
        puVar19 = (uint *)poVar2[uVar11].data;
        if (poVar2[uVar11].sgnd == 0) {
          iVar18 = 0;
        }
        else {
          iVar18 = 1 << ((char)poVar2[uVar11].prec - 1U & 0x1f);
        }
      }
      else {
        uVar8 = opj_version();
        iVar18 = 0;
        fprintf(pFVar7,"P6\n# OpenJPEG-%s\n%d %d\n%d\n",uVar8,(ulong)uVar10,(ulong)uVar4,
                (ulong)uVar11);
        puVar19 = (uint *)0x0;
      }
      poVar2 = image->comps;
      local_5c = 0;
      iVar17 = 0;
      if (poVar2->sgnd != 0) {
        iVar17 = 1 << ((char)poVar2->prec - 1U & 0x1f);
      }
      local_60 = 0;
      if (2 < uVar14) {
        local_60 = 0;
        local_5c = 0;
        if (poVar2[1].sgnd != 0) {
          local_5c = 1 << ((char)poVar2[1].prec - 1U & 0x1f);
        }
        if (poVar2[2].sgnd != 0) {
          local_60 = 1 << ((char)poVar2[2].prec - 1U & 0x1f);
        }
      }
      if (0 < (int)(uVar4 * uVar10)) {
        lVar12 = 0;
        do {
          uVar11 = pOVar3[lVar12];
          if ((int)OVar1 < 9) {
            uVar16 = 0;
            if (0 < (int)uVar11) {
              uVar16 = uVar11;
            }
            uVar16 = uVar16 & 0xff;
            if (0xff < (int)uVar11) {
              uVar16 = 0xff;
            }
            fputc(uVar16,pFVar7);
            if (2 < uVar14) {
              uVar11 = *local_70;
              local_70 = local_70 + 1;
              uVar16 = 0;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              uVar16 = uVar16 & 0xff;
              if (0xff < (int)uVar11) {
                uVar16 = 0xff;
              }
              fputc(uVar16,pFVar7);
              uVar11 = *local_68;
              local_68 = local_68 + 1;
              uVar16 = 0;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              uVar16 = uVar16 & 0xff;
              if (0xff < (int)uVar11) {
                uVar16 = 0xff;
              }
              fputc(uVar16,pFVar7);
            }
            if ((uVar14 == 4) || (uVar14 == 2)) {
              uVar11 = *puVar19;
              puVar19 = puVar19 + 1;
              uVar16 = 0;
              if (0 < (int)uVar11) {
                uVar16 = uVar11;
              }
              uVar16 = uVar16 & 0xff;
              if (0xff < (int)uVar11) {
                uVar16 = 0xff;
              }
              fputc(uVar16,pFVar7);
            }
          }
          else {
            uVar11 = uVar11 + iVar17;
            if ((int)uVar11 < 1) {
              uVar11 = 0;
            }
            if (0xfffe < (int)uVar11) {
              uVar11 = 0xffff;
            }
            fprintf(pFVar7,"%c%c",(ulong)(uVar11 >> 8));
            if (2 < uVar14) {
              uVar11 = *local_70 + local_5c;
              local_70 = local_70 + 1;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if (0xfffe < (int)uVar11) {
                uVar11 = 0xffff;
              }
              fprintf(pFVar7,"%c%c",(ulong)(uVar11 >> 8),(ulong)(uVar11 & 0xff));
              uVar11 = *local_68 + local_60;
              local_68 = local_68 + 1;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              if (0xfffe < (int)uVar11) {
                uVar11 = 0xffff;
              }
              fprintf(pFVar7,"%c%c",(ulong)(uVar11 >> 8));
            }
            if ((uVar14 == 4) || (uVar14 == 2)) {
              uVar11 = *puVar19 + iVar18;
              puVar19 = puVar19 + 1;
              if ((int)uVar11 < 1) {
                uVar11 = 0;
              }
              uVar15 = (ulong)uVar11;
              if (0xfffe < (int)uVar11) {
                uVar15 = 0xffff;
              }
              fprintf(pFVar7,"%c%c",uVar15 >> 8);
            }
          }
          lVar12 = lVar12 + 1;
        } while (uVar4 * uVar10 != (int)lVar12);
      }
      fclose(pFVar7);
    }
    else {
      if (uVar14 < image->numcomps) {
        imagetopnm_cold_1();
      }
      sVar5 = strlen(outfile);
      pcVar6 = (char *)malloc(sVar5 + 8);
      if (pcVar6 == (char *)0x0) {
        imagetopnm_cold_3();
        goto LAB_0010b6cb;
      }
      if (uVar14 != 0) {
        uVar13 = 0;
        do {
          if (uVar14 == 1) {
            strcpy(pcVar6,outfile);
          }
          else {
            sVar5 = strlen(outfile);
            strncpy(pcVar6,outfile,sVar5 - 4);
            sprintf(pcVar6 + (sVar5 - 4),"_%u.pgm",uVar13 & 0xffffffff);
          }
          pFVar7 = fopen(pcVar6,"wb");
          if (pFVar7 == (FILE *)0x0) {
            imagetopnm_cold_2();
            goto LAB_0010b6cb;
          }
          poVar2 = image->comps;
          uVar10 = poVar2[uVar13].w;
          uVar4 = poVar2[uVar13].h;
          OVar1 = poVar2[uVar13].prec;
          uVar8 = opj_version();
          iVar18 = 0;
          fprintf(pFVar7,"P5\n#OpenJPEG-%s\n%d %d\n%d\n",uVar8,(ulong)uVar10,(ulong)uVar4,
                  (ulong)(uint)~(-1 << ((byte)OVar1 & 0x1f)));
          poVar2 = image->comps;
          if (poVar2[uVar13].sgnd != 0) {
            iVar18 = 1 << ((char)poVar2[uVar13].prec - 1U & 0x1f);
          }
          pOVar3 = poVar2[uVar13].data;
          iVar17 = uVar4 * uVar10;
          if ((int)OVar1 < 9) {
            if (0 < iVar17) {
              lVar12 = 0;
              do {
                uVar4 = pOVar3[lVar12] + iVar18;
                uVar10 = 0;
                if (0 < (int)uVar4) {
                  uVar10 = uVar4;
                }
                uVar10 = uVar10 & 0xff;
                if (0xff < (int)uVar4) {
                  uVar10 = 0xff;
                }
                fputc(uVar10,pFVar7);
                lVar12 = lVar12 + 1;
              } while (iVar17 != (int)lVar12);
            }
          }
          else if (0 < iVar17) {
            lVar12 = 0;
            do {
              uVar10 = pOVar3[lVar12] + iVar18;
              if ((int)uVar10 < 1) {
                uVar10 = 0;
              }
              if (0xfffe < (int)uVar10) {
                uVar10 = 0xffff;
              }
              fprintf(pFVar7,"%c%c",(ulong)(uVar10 >> 8),(ulong)uVar10 & 0xff);
              lVar12 = lVar12 + 1;
            } while (iVar17 != (int)lVar12);
          }
          fclose(pFVar7);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar15);
      }
      free(pcVar6);
    }
    iVar18 = 0;
  }
  else {
    fprintf(_stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16\n\t: refused.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/bin/jp2/convert.c"
            ,0x6ea,OVar1);
LAB_0010b6cb:
    iVar18 = 1;
  }
  return iVar18;
}

Assistant:

int imagetopnm(opj_image_t * image, const char *outfile, int force_split)
{
    int *red, *green, *blue, *alpha;
    int wr, hr, max;
    int i;
    unsigned int compno, ncomp;
    int adjustR, adjustG, adjustB, adjustA;
    int fails, two, want_gray, has_alpha, triple;
    int prec, v;
    FILE *fdest = NULL;
    const char *tmp = outfile;
    char *destname;

    alpha = NULL;

    if((prec = (int)image->comps[0].prec) > 16)
    {
        fprintf(stderr,"%s:%d:imagetopnm\n\tprecision %d is larger than 16"
                "\n\t: refused.\n",__FILE__,__LINE__,prec);
        return 1;
    }
    two = has_alpha = 0; fails = 1;
    ncomp = image->numcomps;

    while (*tmp) ++tmp; tmp -= 2;
    want_gray = (*tmp == 'g' || *tmp == 'G');
    ncomp = image->numcomps;

    if(want_gray) ncomp = 1;

    if ((force_split == 0) &&
				(ncomp == 2 /* GRAYA */
            || (ncomp > 2 /* RGB, RGBA */
                && image->comps[0].dx == image->comps[1].dx
                && image->comps[1].dx == image->comps[2].dx
                && image->comps[0].dy == image->comps[1].dy
                && image->comps[1].dy == image->comps[2].dy
                && image->comps[0].prec == image->comps[1].prec
                && image->comps[1].prec == image->comps[2].prec
                )))
		{
        fdest = fopen(outfile, "wb");

        if (!fdest)
        {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", outfile);
            return fails;
        }
        two = (prec > 8);
        triple = (ncomp > 2);
        wr = (int)image->comps[0].w; hr = (int)image->comps[0].h;
        max = (1<<prec) - 1; has_alpha = (ncomp == 4 || ncomp == 2);

        red = image->comps[0].data;

        if(triple)
        {
            green = image->comps[1].data;
            blue = image->comps[2].data;
        }
        else green = blue = NULL;

        if(has_alpha)
        {
            const char *tt = (triple?"RGB_ALPHA":"GRAYSCALE_ALPHA");

            fprintf(fdest, "P7\n# OpenJPEG-%s\nWIDTH %d\nHEIGHT %d\nDEPTH %u\n"
                    "MAXVAL %d\nTUPLTYPE %s\nENDHDR\n", opj_version(),
                    wr, hr, ncomp, max, tt);
            alpha = image->comps[ncomp - 1].data;
            adjustA = (image->comps[ncomp - 1].sgnd ?
                        1 << (image->comps[ncomp - 1].prec - 1) : 0);
        }
        else
        {
            fprintf(fdest, "P6\n# OpenJPEG-%s\n%d %d\n%d\n",
                    opj_version(), wr, hr, max);
            adjustA = 0;
        }
        adjustR = (image->comps[0].sgnd ? 1 << (image->comps[0].prec - 1) : 0);

        if(triple)
        {
            adjustG = (image->comps[1].sgnd ? 1 << (image->comps[1].prec - 1) : 0);
            adjustB = (image->comps[2].sgnd ? 1 << (image->comps[2].prec - 1) : 0);
        }
        else adjustG = adjustB = 0;

        for(i = 0; i < wr * hr; ++i)
        {
            if(two)
            {
                v = *red + adjustR; ++red;
                if(v > 65535) v = 65535; else if(v < 0) v = 0;

                /* netpbm: */
                fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                if(triple)
                {
                    v = *green + adjustG; ++green;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                    v =  *blue + adjustB; ++blue;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                }/* if(triple) */

                if(has_alpha)
                {
                    v = *alpha + adjustA; ++alpha;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);
                }
                continue;

            }	/* if(two) */

            /* prec <= 8: */
            v = *red++;
            if(v > 255) v = 255; else if(v < 0) v = 0;

            fprintf(fdest, "%c", (unsigned char)v);
            if(triple)
            {
                v = *green++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
                v = *blue++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
						}
            if(has_alpha)
            {
                v = *alpha++;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }	/* for(i */

        fclose(fdest); return 0;
    }

    /* YUV or MONO: */

    if (image->numcomps > ncomp)
    {
        fprintf(stderr,"WARNING -> [PGM file] Only the first component\n");
        fprintf(stderr,"           is written to the file\n");
    }
    destname = (char*)malloc(strlen(outfile) + 8);
    if(destname == NULL){
        fprintf(stderr, "imagetopnm: memory out\n");
        return 1;
    }
    for (compno = 0; compno < ncomp; compno++)
    {
        if (ncomp > 1)
        {
            /*sprintf(destname, "%d.%s", compno, outfile);*/
            const size_t olen = strlen(outfile);
            const size_t dotpos = olen - 4;

            strncpy(destname, outfile, dotpos);
            sprintf(destname+dotpos, "_%u.pgm", compno);
        }
        else
            sprintf(destname, "%s", outfile);

        fdest = fopen(destname, "wb");
        if (!fdest)
        {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", destname);
            free(destname);
            return 1;
        }
        wr = (int)image->comps[compno].w; hr = (int)image->comps[compno].h;
        prec = (int)image->comps[compno].prec;
        max = (1<<prec) - 1;

        fprintf(fdest, "P5\n#OpenJPEG-%s\n%d %d\n%d\n",
                opj_version(), wr, hr, max);

        red = image->comps[compno].data;
        adjustR =
                (image->comps[compno].sgnd ? 1 << (image->comps[compno].prec - 1) : 0);

        if(prec > 8)
        {
            for (i = 0; i < wr * hr; i++)
            {
                v = *red + adjustR; ++red;
                if(v > 65535) v = 65535; else if(v < 0) v = 0;

                /* netpbm: */
                fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);

                if(has_alpha)
                {
                    v = *alpha++;
                    if(v > 65535) v = 65535; else if(v < 0) v = 0;

                    /* netpbm: */
                    fprintf(fdest, "%c%c",(unsigned char)(v>>8), (unsigned char)v);
                }
            }/* for(i */
        }
        else /* prec <= 8 */
        {
            for(i = 0; i < wr * hr; ++i)
            {
                v = *red + adjustR; ++red;
                if(v > 255) v = 255; else if(v < 0) v = 0;

                fprintf(fdest, "%c", (unsigned char)v);
            }
        }
        fclose(fdest);
    } /* for (compno */
    free(destname);

    return 0;
}